

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O0

_Bool prof_dump_flush(_Bool propagate_err)

{
  ssize_t sVar1;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  int in_stack_00000024;
  ssize_t err;
  _Bool ret;
  _Bool propagate_err_local;
  
  sVar1 = malloc_write_fd(in_stack_00000024,in_stack_00000018,in_stack_00000010);
  return SUB81(sVar1,0);
}

Assistant:

static bool
prof_dump_flush(bool propagate_err) {
	bool ret = false;
	ssize_t err;

	cassert(config_prof);

	err = malloc_write_fd(prof_dump_fd, prof_dump_buf, prof_dump_buf_end);
	if (err == -1) {
		if (!propagate_err) {
			malloc_write("<jemalloc>: write() failed during heap "
			    "profile flush\n");
			if (opt_abort) {
				abort();
			}
		}
		ret = true;
	}
	prof_dump_buf_end = 0;

	return ret;
}